

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O2

HRESULT utf8::NarrowStringToWideNoAlloc
                  (LPCSTR sourceString,size_t sourceCount,LPWSTR destString,size_t destBufferCount,
                  charcount_t *destCount)

{
  code *pcVar1;
  HRESULT HVar2;
  charcount_t cVar3;
  int iVar4;
  ulong uVar5;
  PAL_FILE *pPVar6;
  ulong uVar7;
  size_t sVar8;
  LPWSTR pWVar9;
  ulong uVar10;
  
  HVar2 = -0x7ff8fff2;
  if (sourceCount < 0xffffffff) {
    if (destString == (LPWSTR)0x0) {
      return -0x7ff8ffa9;
    }
    HVar2 = -0x7ff8ffa9;
    if (sourceCount < destBufferCount) {
      uVar10 = 0;
      pWVar9 = destString;
      do {
        if (sourceCount == uVar10) {
LAB_00109506:
          *destCount = (charcount_t)sourceCount;
          destString[sourceCount] = L'\0';
          sVar8 = sourceCount;
LAB_0010950f:
          if (destString[sVar8] == L'\0') {
            return 0;
          }
          pPVar6 = PAL_get_stderr(0);
          PAL_fprintf(pPVar6,"ASSERTION (%s, line %d) %s %s\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                      ,0xaa,"destString[*destCount] == 0","destString[*destCount] == 0");
          pPVar6 = PAL_get_stderr(0);
          PAL_fflush(pPVar6);
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        if (sourceString[uVar10] < '\x01') {
          uVar5 = 3;
          if (uVar10 < 3) {
            uVar5 = uVar10;
          }
          if (uVar5 + sourceCount != uVar10) {
            uVar5 = 3;
            if (uVar10 < 3) {
              uVar5 = uVar10;
            }
            cVar3 = ByteIndexIntoCharacterIndex
                              ((LPCUTF8)(sourceString + (uVar10 - uVar5)),
                               (sourceCount + uVar5) - uVar10,doDefault);
            uVar7 = (uint)-(int)uVar5 + uVar10 + (ulong)cVar3;
            sVar8 = uVar7 & 0xffffffff;
            if (sourceCount < sVar8) {
              return -0x7ff8fff2;
            }
            iVar4 = 3;
            if (uVar10 < 3) {
              iVar4 = (int)uVar10;
            }
            DecodeUnitsIntoAndNullTerminateNoAdvance
                      ((char16 *)((long)pWVar9 - (ulong)(uint)(iVar4 * 2)),
                       (LPCUTF8)(sourceString + (uVar10 - uVar5)),
                       (LPCUTF8)(sourceString + sourceCount),doAllowInvalidWCHARs,(bool *)0x0);
            *destCount = (charcount_t)uVar7;
            goto LAB_0010950f;
          }
          goto LAB_00109506;
        }
        destString[uVar10] = (short)sourceString[uVar10];
        uVar10 = uVar10 + 1;
        pWVar9 = pWVar9 + 1;
      } while( true );
    }
  }
  *destString = L'\0';
  return HVar2;
}

Assistant:

inline HRESULT NarrowStringToWideNoAlloc(_In_ LPCSTR sourceString, size_t sourceCount,
        __out_ecount(destBufferCount) LPWSTR destString, size_t destBufferCount, _Out_ charcount_t* destCount)
    {
        size_t sourceStart = 0;
        size_t cbSourceString = sourceCount;

        if (sourceCount >= MAXUINT32)
        {
            destString[0] = WCHAR(0);
            return E_OUTOFMEMORY;
        }

        if (destString == nullptr)
        {
            return E_INVALIDARG;
        }

        if (sourceCount >= destBufferCount)
        {
            destString[0] = WCHAR(0);
            return E_INVALIDARG;
        }

        for (; sourceStart < sourceCount; sourceStart++)
        {
            const char ch = sourceString[sourceStart];
            if ( ! (ch > 0 && ch < 0x0080) )
            {
                size_t fallback = sourceStart > 3 ? 3 : sourceStart; // 3 + 1 -> fallback at least 1 unicode char
                sourceStart -= fallback;
                break;
            }
            destString[sourceStart] = (WCHAR) ch;
        }

        if (sourceStart == sourceCount)
        {
            *destCount = static_cast<charcount_t>(sourceCount);
            destString[sourceCount] = WCHAR(0);
        }
        else
        {
            LPCUTF8 remSourceString = (LPCUTF8)sourceString + sourceStart;
            WCHAR *remDestString = destString + sourceStart;

            charcount_t cchDestString = utf8::ByteIndexIntoCharacterIndex(remSourceString, cbSourceString - sourceStart);
            cchDestString += (charcount_t)sourceStart;
            if (cchDestString > sourceCount)
            {
                return E_OUTOFMEMORY;
            }

            // Some node tests depend on the utf8 decoder not swallowing invalid unicode characters
            // instead of replacing them with the "replacement" chracter. Pass a flag to our
            // decoder to require such behavior
            utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(remDestString, remSourceString, (LPCUTF8) sourceString + cbSourceString, DecodeOptions::doAllowInvalidWCHARs);

            static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
            *destCount = cchDestString;
        }

        Assert(destString[*destCount] == 0);

        return S_OK;
    }